

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_cb49ff::Joystick::did_set_input
          (Joystick *this,Input *digital_input,bool is_active)

{
  undefined1 local_40 [8];
  anon_class_16_2_48de597a apply_sinclair;
  anon_class_16_2_48de597a apply_kempston;
  bool is_active_local;
  Input *digital_input_local;
  Joystick *this_local;
  
  local_40 = (undefined1  [8])((long)&apply_kempston.this + 7);
  apply_sinclair.is_active = (bool *)this;
  apply_sinclair.this = (Joystick *)local_40;
  apply_kempston.is_active = (bool *)this;
  apply_kempston.this._7_1_ = is_active;
  switch(digital_input->type) {
  case Up:
    did_set_input::anon_class_16_2_48de597a::operator()
              ((anon_class_16_2_48de597a *)&apply_sinclair.this,'\b');
    did_set_input::anon_class_16_2_48de597a::operator()((anon_class_16_2_48de597a *)local_40,0x802);
    break;
  case Down:
    did_set_input::anon_class_16_2_48de597a::operator()
              ((anon_class_16_2_48de597a *)&apply_sinclair.this,'\x04');
    did_set_input::anon_class_16_2_48de597a::operator()((anon_class_16_2_48de597a *)local_40,0x404);
    break;
  case Left:
    did_set_input::anon_class_16_2_48de597a::operator()
              ((anon_class_16_2_48de597a *)&apply_sinclair.this,'\x02');
    did_set_input::anon_class_16_2_48de597a::operator()((anon_class_16_2_48de597a *)local_40,0x110);
    break;
  case Right:
    did_set_input::anon_class_16_2_48de597a::operator()
              ((anon_class_16_2_48de597a *)&apply_sinclair.this,'\x01');
    did_set_input::anon_class_16_2_48de597a::operator()((anon_class_16_2_48de597a *)local_40,0x208);
    break;
  default:
    break;
  case Fire:
    did_set_input::anon_class_16_2_48de597a::operator()
              ((anon_class_16_2_48de597a *)&apply_sinclair.this,'\x10');
    did_set_input::anon_class_16_2_48de597a::operator()((anon_class_16_2_48de597a *)local_40,0x1001)
    ;
  }
  return;
}

Assistant:

void did_set_input(const Input &digital_input, bool is_active) final {
#define APPLY(b)	if(is_active) state_ &= ~b; else state_ |= b;
			switch(digital_input.type) {
				default: return;
				case Input::Right:	APPLY(0x02);	break;
				case Input::Left:	APPLY(0x01);	break;
				case Input::Down:	APPLY(0x08);	break;
				case Input::Up:		APPLY(0x10);	break;
				case Input::Fire:	APPLY(0x20);	break;
			}
#undef APPLY
		}